

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::globalQualifierTypeCheck
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TPublicType *publicType)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  TPublicType *publicType_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  bVar1 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable);
  if (bVar1) {
    if (((publicType->userDef == (TType *)0x0) ||
        (bVar1 = TType::isReference(publicType->userDef), !bVar1)) &&
       (((this->super_TParseContextBase).parsingBuiltins & 1U) == 0)) {
      bVar1 = TQualifier::isMemoryQualifierImageAndSSBOOnly(qualifier);
      if (((!bVar1) || (bVar1 = TPublicType::isImage(publicType), bVar1)) ||
         (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 6)) {
        bVar1 = TQualifier::isMemory(qualifier);
        if (((bVar1) && (publicType->basicType != EbtSampler)) &&
           (bVar1 = TQualifier::isUniformOrBuffer(&publicType->qualifier), !bVar1)) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"memory qualifiers cannot be used on this type","");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"memory qualifiers cannot be used on this type","");
      }
    }
    if (((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 6) &&
        (publicType->basicType != EbtBlock)) &&
       (bVar1 = TQualifier::hasBufferReference(qualifier), !bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"buffers can be declared only as blocks","buffer","");
    }
    if (((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 3) &&
        (publicType->basicType == EbtDouble)) &&
       ((uVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                           (this,"GL_ARB_vertex_attrib_64bit"), (uVar2 & 1) != 0 &&
        (((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex &&
         ((this->super_TParseContextBase).super_TParseVersions.version < 400)))))) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x19a,"GL_ARB_gpu_shader_fp64",
                 "vertex-shader `double` type");
    }
    if ((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 3) ||
       (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 4)) {
      bVar1 = TShaderQualifiers::hasBlendEquation(&publicType->shaderQualifiers);
      if (bVar1) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"can only be applied to a standalone \'out\'","blend equation","");
      }
      if ((publicType->basicType == EbtBool) &&
         (((this->super_TParseContextBase).parsingBuiltins & 1U) == 0)) {
        pcVar3 = GetStorageQualifierString
                           ((TStorageQualifier)*(undefined8 *)&qualifier->field_0x8 & 0x7f);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot be bool",pcVar3,"");
      }
      else {
        bVar1 = isTypeInt(publicType->basicType);
        if ((bVar1) || (publicType->basicType == EbtDouble)) {
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,8,300,(char *)0x0,"non-float shader input/output");
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,-9,0x82,(char *)0x0,"non-float shader input/output")
          ;
        }
        if ((((((*(ulong *)&qualifier->field_0x8 >> 0x1f & 1) == 0) &&
              (bVar1 = TQualifier::isExplicitInterpolation(qualifier), !bVar1)) &&
             (bVar1 = TQualifier::isPervertexNV(qualifier), !bVar1)) &&
            (bVar1 = TQualifier::isPervertexEXT(qualifier), !bVar1)) &&
           (((bVar1 = isTypeInt(publicType->basicType), bVar1 ||
             (publicType->basicType == EbtDouble)) ||
            ((publicType->userDef != (TType *)0x0 &&
             (((uVar2 = (*publicType->userDef->_vptr_TType[0x32])(publicType->userDef,8),
               (uVar2 & 1) != 0 ||
               (uVar2 = (*publicType->userDef->_vptr_TType[0x32])(publicType->userDef,9),
               (uVar2 & 1) != 0)) ||
              ((bVar1 = TType::contains16BitInt(publicType->userDef), bVar1 ||
               (((bVar1 = TType::contains8BitInt(publicType->userDef), bVar1 ||
                 (bVar1 = TType::contains64BitInt(publicType->userDef), bVar1)) ||
                (bVar1 = TType::containsDouble(publicType->userDef), bVar1)))))))))))) {
          if ((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 3) &&
             ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)) {
            pcVar3 = TType::getBasicString(publicType->basicType);
            pcVar4 = GetStorageQualifierString
                               ((TStorageQualifier)*(undefined8 *)&qualifier->field_0x8 & 0x7f);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"must be qualified as flat",pcVar3,pcVar4);
          }
          else if ((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 4) &&
                  (((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex
                   && ((this->super_TParseContextBase).super_TParseVersions.version == 300)))) {
            pcVar3 = TType::getBasicString(publicType->basicType);
            pcVar4 = GetStorageQualifierString
                               ((TStorageQualifier)*(undefined8 *)&qualifier->field_0x8 & 0x7f);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"must be qualified as flat",pcVar3,pcVar4);
          }
        }
        bVar1 = TQualifier::isPatch(qualifier);
        if ((bVar1) && (bVar1 = TQualifier::isInterpolation(qualifier), bVar1)) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot use interpolation qualifiers with patch","patch","");
        }
        bVar1 = TQualifier::isTaskPayload(qualifier);
        if ((bVar1) && (publicType->basicType == EbtBlock)) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,
                     "taskPayloadSharedEXT variables should not be declared as interface blocks",
                     "taskPayloadSharedEXT","");
        }
        bVar1 = TQualifier::isTaskMemory(qualifier);
        if ((bVar1) && (publicType->basicType != EbtBlock)) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"taskNV variables can be declared only as blocks","taskNV","");
        }
        if (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 3) {
          switch((this->super_TParseContextBase).super_TParseVersions.language) {
          case EShLangVertex:
            if (publicType->basicType == EbtStruct) {
              pcVar3 = GetStorageQualifierString
                                 ((TStorageQualifier)*(undefined8 *)&qualifier->field_0x8 & 0x7f);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"cannot be a structure",pcVar3,"");
            }
            else {
              if (publicType->arraySizes != (TArraySizes *)0x0) {
                TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"vertex input arrays");
                TParseVersions::profileRequires
                          ((TParseVersions *)this,loc,1,0x96,(char *)0x0,"vertex input arrays");
              }
              if (publicType->basicType == EbtDouble) {
                TParseVersions::profileRequires
                          ((TParseVersions *)this,loc,-9,0x19a,"GL_ARB_vertex_attrib_64bit",
                           "vertex-shader `double` type input");
              }
              bVar1 = TQualifier::isAuxiliary(qualifier);
              if (((bVar1) || (bVar1 = TQualifier::isInterpolation(qualifier), bVar1)) ||
                 ((bVar1 = TQualifier::isMemory(qualifier), bVar1 ||
                  ((*(ulong *)&qualifier->field_0x8 >> 0x1c & 1) != 0)))) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"vertex input cannot be further qualified","");
              }
            }
            break;
          case EShLangTessControl:
            if ((*(ulong *)&qualifier->field_0x8 >> 0x2c & 1) != 0) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"can only use on output in tessellation-control shader","patch",""
                        );
            }
            break;
          default:
            break;
          case EShLangFragment:
            if (publicType->userDef != (TType *)0x0) {
              TParseVersions::profileRequires
                        ((TParseVersions *)this,loc,8,300,(char *)0x0,"fragment-shader struct input"
                        );
              TParseVersions::profileRequires
                        ((TParseVersions *)this,loc,-9,0x96,(char *)0x0,
                         "fragment-shader struct input");
              uVar2 = (*publicType->userDef->_vptr_TType[0x34])();
              if ((uVar2 & 1) != 0) {
                TParseVersions::requireProfile
                          ((TParseVersions *)this,loc,-9,
                           "fragment-shader struct input containing structure");
              }
              uVar2 = (*publicType->userDef->_vptr_TType[0x33])();
              if ((uVar2 & 1) != 0) {
                TParseVersions::requireProfile
                          ((TParseVersions *)this,loc,-9,
                           "fragment-shader struct input containing an array");
              }
            }
            break;
          case EShLangCompute:
            bVar1 = TSymbolTable::atBuiltInLevel((this->super_TParseContextBase).symbolTable);
            if (!bVar1) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,
                         "global storage input qualifier cannot be used in a compute shader","in",""
                        );
            }
          }
        }
        else {
          switch((this->super_TParseContextBase).super_TParseVersions.language) {
          case EShLangVertex:
            if (publicType->userDef != (TType *)0x0) {
              TParseVersions::profileRequires
                        ((TParseVersions *)this,loc,8,300,(char *)0x0,"vertex-shader struct output")
              ;
              TParseVersions::profileRequires
                        ((TParseVersions *)this,loc,-9,0x96,(char *)0x0,
                         "vertex-shader struct output");
              uVar2 = (*publicType->userDef->_vptr_TType[0x34])();
              if ((uVar2 & 1) != 0) {
                TParseVersions::requireProfile
                          ((TParseVersions *)this,loc,-9,
                           "vertex-shader struct output containing structure");
              }
              uVar2 = (*publicType->userDef->_vptr_TType[0x33])();
              if ((uVar2 & 1) != 0) {
                TParseVersions::requireProfile
                          ((TParseVersions *)this,loc,-9,
                           "vertex-shader struct output containing an array");
              }
            }
            break;
          default:
            break;
          case EShLangTessEvaluation:
            if ((*(ulong *)&qualifier->field_0x8 >> 0x2c & 1) != 0) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"can only use on input in tessellation-evaluation shader","patch",
                         "");
            }
            break;
          case EShLangFragment:
            TParseVersions::profileRequires
                      ((TParseVersions *)this,loc,8,300,(char *)0x0,"fragment shader output");
            if (publicType->basicType == EbtStruct) {
              pcVar3 = GetStorageQualifierString
                                 ((TStorageQualifier)*(undefined8 *)&qualifier->field_0x8 & 0x7f);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"cannot be a structure",pcVar3,"");
            }
            else if ((*(ushort *)&publicType->field_0xb8 >> 8 & 0xf) == 0) {
              bVar1 = TQualifier::isAuxiliary(qualifier);
              if (bVar1) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"can\'t use auxiliary qualifier on a fragment output",
                           "centroid/sample/patch","");
              }
              bVar1 = TQualifier::isInterpolation(qualifier);
              if (bVar1) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"can\'t use interpolation qualifier on a fragment output",
                           "flat/smooth/noperspective","");
              }
              if (((publicType->basicType == EbtDouble) || (publicType->basicType == EbtInt64)) ||
                 (publicType->basicType == EbtUint64)) {
                pcVar3 = GetStorageQualifierString
                                   ((TStorageQualifier)*(undefined8 *)&qualifier->field_0x8 & 0x7f);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"cannot contain a double, int64, or uint64",pcVar3,"");
              }
            }
            else {
              pcVar3 = GetStorageQualifierString
                                 ((TStorageQualifier)*(undefined8 *)&qualifier->field_0x8 & 0x7f);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"cannot be a matrix",pcVar3,"");
            }
            break;
          case EShLangCompute:
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"global storage output qualifier cannot be used in a compute shader"
                       ,"out","");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::globalQualifierTypeCheck(const TSourceLoc& loc, const TQualifier& qualifier, const TPublicType& publicType)
{
    if (! symbolTable.atGlobalLevel())
        return;

    if (!(publicType.userDef && publicType.userDef->isReference()) && !parsingBuiltins) {
        if (qualifier.isMemoryQualifierImageAndSSBOOnly() && ! publicType.isImage() && publicType.qualifier.storage != EvqBuffer) {
            error(loc, "memory qualifiers cannot be used on this type", "", "");
        } else if (qualifier.isMemory() && (publicType.basicType != EbtSampler) && !publicType.qualifier.isUniformOrBuffer()) {
            error(loc, "memory qualifiers cannot be used on this type", "", "");
        }
    }

    if (qualifier.storage == EvqBuffer &&
        publicType.basicType != EbtBlock &&
        !qualifier.hasBufferReference())
        error(loc, "buffers can be declared only as blocks", "buffer", "");

    if (qualifier.storage != EvqVaryingIn && publicType.basicType == EbtDouble &&
        extensionTurnedOn(E_GL_ARB_vertex_attrib_64bit) && language == EShLangVertex &&
        version < 400) {
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 410, E_GL_ARB_gpu_shader_fp64, "vertex-shader `double` type");
    }
    if (qualifier.storage != EvqVaryingIn && qualifier.storage != EvqVaryingOut)
        return;

    if (publicType.shaderQualifiers.hasBlendEquation())
        error(loc, "can only be applied to a standalone 'out'", "blend equation", "");

    // now, knowing it is a shader in/out, do all the in/out semantic checks

    if (publicType.basicType == EbtBool && !parsingBuiltins) {
        error(loc, "cannot be bool", GetStorageQualifierString(qualifier.storage), "");
        return;
    }

    if (isTypeInt(publicType.basicType) || publicType.basicType == EbtDouble) {
        profileRequires(loc, EEsProfile, 300, nullptr, "non-float shader input/output");
        profileRequires(loc, ~EEsProfile, 130, nullptr, "non-float shader input/output");
    }

    if (!qualifier.flat && !qualifier.isExplicitInterpolation() && !qualifier.isPervertexNV() && !qualifier.isPervertexEXT()) {
        if (isTypeInt(publicType.basicType) ||
            publicType.basicType == EbtDouble ||
            (publicType.userDef && (   publicType.userDef->containsBasicType(EbtInt)
                                    || publicType.userDef->containsBasicType(EbtUint)
                                    || publicType.userDef->contains16BitInt()
                                    || publicType.userDef->contains8BitInt()
                                    || publicType.userDef->contains64BitInt()
                                    || publicType.userDef->containsDouble()))) {
            if (qualifier.storage == EvqVaryingIn && language == EShLangFragment)
                error(loc, "must be qualified as flat", TType::getBasicString(publicType.basicType), GetStorageQualifierString(qualifier.storage));
            else if (qualifier.storage == EvqVaryingOut && language == EShLangVertex && version == 300)
                error(loc, "must be qualified as flat", TType::getBasicString(publicType.basicType), GetStorageQualifierString(qualifier.storage));
        }
    }

    if (qualifier.isPatch() && qualifier.isInterpolation())
        error(loc, "cannot use interpolation qualifiers with patch", "patch", "");

    if (qualifier.isTaskPayload() && publicType.basicType == EbtBlock)
        error(loc, "taskPayloadSharedEXT variables should not be declared as interface blocks", "taskPayloadSharedEXT", "");

    if (qualifier.isTaskMemory() && publicType.basicType != EbtBlock)
        error(loc, "taskNV variables can be declared only as blocks", "taskNV", "");

    if (qualifier.storage == EvqVaryingIn) {
        switch (language) {
        case EShLangVertex:
            if (publicType.basicType == EbtStruct) {
                error(loc, "cannot be a structure", GetStorageQualifierString(qualifier.storage), "");
                return;
            }
            if (publicType.arraySizes) {
                requireProfile(loc, ~EEsProfile, "vertex input arrays");
                profileRequires(loc, ENoProfile, 150, nullptr, "vertex input arrays");
            }
            if (publicType.basicType == EbtDouble)
                profileRequires(loc, ~EEsProfile, 410, E_GL_ARB_vertex_attrib_64bit, "vertex-shader `double` type input");
            if (qualifier.isAuxiliary() || qualifier.isInterpolation() || qualifier.isMemory() || qualifier.invariant)
                error(loc, "vertex input cannot be further qualified", "", "");
            break;
        case EShLangFragment:
            if (publicType.userDef) {
                profileRequires(loc, EEsProfile, 300, nullptr, "fragment-shader struct input");
                profileRequires(loc, ~EEsProfile, 150, nullptr, "fragment-shader struct input");
                if (publicType.userDef->containsStructure())
                    requireProfile(loc, ~EEsProfile, "fragment-shader struct input containing structure");
                if (publicType.userDef->containsArray())
                    requireProfile(loc, ~EEsProfile, "fragment-shader struct input containing an array");
            }
            break;
       case EShLangCompute:
            if (! symbolTable.atBuiltInLevel())
                error(loc, "global storage input qualifier cannot be used in a compute shader", "in", "");
            break;
       case EShLangTessControl:
            if (qualifier.patch)
                error(loc, "can only use on output in tessellation-control shader", "patch", "");
            break;
        default:
            break;
        }
    } else {
        // qualifier.storage == EvqVaryingOut
        switch (language) {
        case EShLangVertex:
            if (publicType.userDef) {
                profileRequires(loc, EEsProfile, 300, nullptr, "vertex-shader struct output");
                profileRequires(loc, ~EEsProfile, 150, nullptr, "vertex-shader struct output");
                if (publicType.userDef->containsStructure())
                    requireProfile(loc, ~EEsProfile, "vertex-shader struct output containing structure");
                if (publicType.userDef->containsArray())
                    requireProfile(loc, ~EEsProfile, "vertex-shader struct output containing an array");
            }

            break;
        case EShLangFragment:
            profileRequires(loc, EEsProfile, 300, nullptr, "fragment shader output");
            if (publicType.basicType == EbtStruct) {
                error(loc, "cannot be a structure", GetStorageQualifierString(qualifier.storage), "");
                return;
            }
            if (publicType.matrixRows > 0) {
                error(loc, "cannot be a matrix", GetStorageQualifierString(qualifier.storage), "");
                return;
            }
            if (qualifier.isAuxiliary())
                error(loc, "can't use auxiliary qualifier on a fragment output", "centroid/sample/patch", "");
            if (qualifier.isInterpolation())
                error(loc, "can't use interpolation qualifier on a fragment output", "flat/smooth/noperspective", "");
            if (publicType.basicType == EbtDouble || publicType.basicType == EbtInt64 || publicType.basicType == EbtUint64)
                error(loc, "cannot contain a double, int64, or uint64", GetStorageQualifierString(qualifier.storage), "");
        break;

        case EShLangCompute:
            error(loc, "global storage output qualifier cannot be used in a compute shader", "out", "");
            break;
        case EShLangTessEvaluation:
            if (qualifier.patch)
                error(loc, "can only use on input in tessellation-evaluation shader", "patch", "");
            break;
        default:
            break;
        }
    }
}